

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2a7d7c::WaveBackend::~WaveBackend(WaveBackend *this)

{
  ~WaveBackend(this);
  al_free(this);
  return;
}

Assistant:

WaveBackend::~WaveBackend()
{
    if(mFile)
        fclose(mFile);
    mFile = nullptr;
}